

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteAliasedRaw
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  int iVar1;
  ptrdiff_t pVar2;
  uint8 *puVar3;
  
  pVar2 = GetSize(this,ptr);
  if (size < pVar2) {
    puVar3 = WriteRaw(this,data,size,ptr);
    return puVar3;
  }
  puVar3 = Trim(this,ptr);
  iVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[5])(this->stream_,data,(ulong)(uint)size);
  if ((char)iVar1 == '\0') {
    this->had_error_ = true;
    puVar3 = this->buffer_;
    this->end_ = this->buffer_ + 0x10;
  }
  return puVar3;
}

Assistant:

uint8* EpsCopyOutputStream::WriteAliasedRaw(const void* data, int size,
                                            uint8* ptr) {
  if (size < GetSize(ptr)
  ) {
    return WriteRaw(data, size, ptr);
  } else {
    ptr = Trim(ptr);
    if (stream_->WriteAliasedRaw(data, size)) return ptr;
    return Error();
  }
}